

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.cpp
# Opt level: O3

void __thiscall
Nova::Boundary_Uniform<float,_2>::Find_Ghost_Regions
          (Boundary_Uniform<float,_2> *this,T_Grid *grid,Array<Nova::Range<int,_2>_> *regions,
          int number_of_ghost_cells)

{
  ulong uVar1;
  pointer pRVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  T_STORAGE TVar8;
  T_STORAGE TVar9;
  
  uVar1 = *(ulong *)(grid->counts)._data._M_elems;
  std::vector<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>::resize(&regions->_data,4)
  ;
  pRVar2 = (regions->_data).
           super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((regions->_data).
      super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pRVar2) {
    uVar7 = 0;
    uVar5 = 0;
  }
  else {
    uVar3 = uVar1 & 0xffffffff00000000;
    uVar6 = (ulong)(1 - number_of_ghost_cells);
    *(ulong *)(pRVar2->min_corner)._data._M_elems = uVar6 | 0x100000000;
    *(ulong *)(pRVar2->max_corner)._data._M_elems = uVar3;
    pRVar2 = (regions->_data).
             super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(regions->_data).
                  super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 4;
    if (uVar5 < 2) {
      uVar7 = 1;
    }
    else {
      uVar4 = (int)uVar1 + number_of_ghost_cells;
      TVar8._M_elems[1] = 0;
      TVar8._M_elems[0] = uVar4;
      pRVar2[1].min_corner._data = (T_STORAGE)((ulong)((int)uVar1 + 1) | 0x100000000);
      *&pRVar2[1].max_corner._data._M_elems = uVar3 | TVar8._M_elems;
      pRVar2 = (regions->_data).
               super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)(regions->_data).
                    super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 4;
      if (uVar5 < 3) {
        uVar7 = 2;
      }
      else {
        pRVar2[2].min_corner._data = (T_STORAGE)(uVar6 * 0x100000001);
        *&pRVar2[2].max_corner._data._M_elems = TVar8._M_elems;
        pRVar2 = (regions->_data).
                 super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = (long)(regions->_data).
                      super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 4;
        if (3 < uVar5) {
          TVar9._M_elems[1] = (int)(uVar1 >> 0x20) + number_of_ghost_cells;
          TVar9._M_elems[0] = uVar4;
          pRVar2[3].min_corner._data = (T_STORAGE)(uVar3 + 0x100000000 | uVar6);
          *&pRVar2[3].max_corner._data._M_elems = TVar9._M_elems;
          return;
        }
        uVar7 = 3;
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7,uVar5
            );
}

Assistant:

void Boundary_Uniform<T,d>::
Find_Ghost_Regions(const T_Grid& grid,Array<Range<int,d> >& regions,const int number_of_ghost_cells) const
{
    Range<int,d> domain=grid.Cell_Indices(),ghost=domain.Thickened(number_of_ghost_cells);
    regions.resize(T_Grid::number_of_faces_per_cell);
    Find_Ghost_Regions_Helper(regions,domain,ghost);
}